

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall TypeFactory::saveXmlCoreTypes(TypeFactory *this,ostream *s)

{
  bool bVar1;
  type_metatype tVar2;
  reference ppDVar3;
  iterator iStack_38;
  type_metatype meta;
  _Base_ptr local_30;
  Datatype *local_28;
  Datatype *ct;
  const_iterator iter;
  ostream *s_local;
  TypeFactory *this_local;
  
  iter._M_node = (_Base_ptr)s;
  std::_Rb_tree_const_iterator<Datatype_*>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<Datatype_*> *)&ct);
  std::operator<<((ostream *)iter._M_node,"<coretypes>\n");
  local_30 = (_Base_ptr)
             std::set<Datatype_*,_DatatypeCompare,_std::allocator<Datatype_*>_>::begin(&this->tree);
  ct = (Datatype *)local_30;
  while( true ) {
    iStack_38 = std::set<Datatype_*,_DatatypeCompare,_std::allocator<Datatype_*>_>::end(&this->tree)
    ;
    bVar1 = std::operator!=((_Self *)&ct,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    ppDVar3 = std::_Rb_tree_const_iterator<Datatype_*>::operator*
                        ((_Rb_tree_const_iterator<Datatype_*> *)&ct);
    local_28 = *ppDVar3;
    bVar1 = Datatype::isCoreType(local_28);
    if ((((bVar1) && (tVar2 = Datatype::getMetatype(local_28), tVar2 != TYPE_PTR)) &&
        (tVar2 != TYPE_ARRAY)) && (tVar2 != TYPE_STRUCT)) {
      std::operator<<((ostream *)iter._M_node,' ');
      (*local_28->_vptr_Datatype[0xb])(local_28,iter._M_node);
      std::operator<<((ostream *)iter._M_node,'\n');
    }
    std::_Rb_tree_const_iterator<Datatype_*>::operator++((_Rb_tree_const_iterator<Datatype_*> *)&ct)
    ;
  }
  std::operator<<((ostream *)iter._M_node,"</coretypes>\n");
  return;
}

Assistant:

void TypeFactory::saveXmlCoreTypes(ostream &s) const

{
  DatatypeSet::const_iterator iter;
  Datatype *ct;

  s << "<coretypes>\n";
  for(iter=tree.begin();iter!=tree.end();++iter) {
    ct = *iter;
    if (!ct->isCoreType()) continue;
    type_metatype meta = ct->getMetatype();
    if ((meta==TYPE_PTR)||(meta==TYPE_ARRAY)||
	(meta==TYPE_STRUCT))
      continue;
    s << ' ';
    ct->saveXml(s);
    s << '\n';
  }
  s << "</coretypes>\n";
}